

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrix33.h
# Opt level: O2

void __thiscall
chrono::ChMatrix33<double>::Set_A_Xdir
          (ChMatrix33<double> *this,ChVector<double> *Xdir,ChVector<double> *Vsingular)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  undefined1 auVar5 [64];
  ChVector<double> mZ;
  ChVector<double> mY;
  ChVector<double> mX;
  ChVector<double> local_78;
  ChVector<double> local_58;
  ChVector<double> local_38;
  undefined1 auVar4 [64];
  
  local_78.m_data[2] = 0.0;
  local_38.m_data[2] = 0.0;
  local_58.m_data[2] = 0.0;
  local_38.m_data[0] = 0.0;
  local_38.m_data[1] = 0.0;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_78.m_data[0] = 0.0;
  local_78.m_data[1] = 0.0;
  ChVector<double>::DirToDxDyDz(Xdir,&local_38,&local_58,&local_78,Vsingular);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_38.m_data[2];
  auVar3 = vbroadcastsd_avx512f(auVar1);
  auVar3 = vpermi2pd_avx512f(_DAT_00e820c0,
                             ZEXT2464(CONCAT816(auVar3._16_8_,
                                                CONCAT88(local_38.m_data[1],local_38.m_data[0]))),
                             ZEXT1664(CONCAT88(local_58.m_data[1],local_58.m_data[0])));
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_58.m_data[2];
  auVar4 = vbroadcastsd_avx512f(auVar2);
  auVar5._0_40_ = auVar3._0_40_;
  auVar5._40_8_ = auVar4._40_8_;
  auVar5._48_8_ = auVar3._48_8_;
  auVar5._56_8_ = auVar3._56_8_;
  auVar3 = vpermi2pd_avx512f(_DAT_00e82100,auVar5,
                             ZEXT1664(CONCAT88(local_78.m_data[1],local_78.m_data[0])));
  *(undefined1 (*) [64])
   (this->super_Matrix<double,_3,_3,_1,_3,_3>).
   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array = auVar3;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_78.m_data[2];
  return;
}

Assistant:

inline void ChMatrix33<Real>::Set_A_Xdir(const ChVector<Real>& Xdir, const ChVector<Real>& Vsingular) {
    ChVector<Real> mX;
    ChVector<Real> mY;
    ChVector<Real> mZ;
    Xdir.DirToDxDyDz(mX, mY, mZ, Vsingular);
    this->Set_A_axis(mX, mY, mZ);
}